

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

bool ExecuteProblemSpace(shared_ptr<celero::ExperimentResult> *r)

{
  ExperimentResult *this;
  bool bVar1;
  bool bVar2;
  Experiment *pEVar3;
  uint64_t uVar4;
  ostream *poVar5;
  shared_ptr<celero::Factory> sVar6;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  anon_class_16_1_54a39812 testRunner;
  undefined1 local_c9;
  Experiment local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [32];
  anon_class_16_1_54a39812 local_98;
  undefined1 local_88 [32];
  shared_ptr<celero::UserDefinedMeasurementCollector> local_68;
  shared_ptr<celero::UserDefinedMeasurementCollector> local_58;
  shared_ptr<celero::UserDefinedMeasurementCollector> local_48;
  
  local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi;
  if (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pEVar3 = celero::ExperimentResult::getExperiment
                     ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  uVar4 = celero::Experiment::getSamples(pEVar3);
  if (uVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Celero Test \"",0x14);
    celero::ExperimentResult::getExperiment
              ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    celero::Experiment::getBenchmark(&local_c8);
    celero::Benchmark::getName_abi_cxx11_
              ((string *)local_b8,
               (Benchmark *)
               local_c8.pimpl._pimpl._M_t.
               super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
               .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_b8._0_8_,local_b8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::",2);
    pEVar3 = celero::ExperimentResult::getExperiment
                       ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr);
    celero::Experiment::getName_abi_cxx11_((string *)local_88,pEVar3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_88._0_8_,local_88._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\" must have at least 1 sample.",0x1e);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((element_type *)local_88._0_8_ != (element_type *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if ((UserDefinedMeasurementCollector *)local_b8._0_8_ !=
        (UserDefinedMeasurementCollector *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
  }
  else {
    local_48.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_48.super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar1 = ExecuteProblemSpace::anon_class_16_1_54a39812::operator()(&local_98,false,&local_48);
    if (local_48.
        super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (bVar1) {
      pEVar3 = celero::ExperimentResult::getExperiment
                         ((r->
                          super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      sVar6 = celero::Experiment::getFactory(pEVar3);
      (**(code **)((long)*(Pimpl<celero::Benchmark::Impl> *)
                          local_c8.pimpl._pimpl._M_t.
                          super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
                          .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl +
                  0x10))(local_88,local_c8.pimpl._pimpl._M_t.
                                  super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
                                  .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>.
                                  _M_head_impl,
                         sVar6.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._M_pi);
      local_b8._0_8_ = (UserDefinedMeasurementCollector *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<celero::UserDefinedMeasurementCollector,std::allocator<celero::UserDefinedMeasurementCollector>,std::shared_ptr<celero::TestFixture>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),
                 (UserDefinedMeasurementCollector **)local_b8,
                 (allocator<celero::UserDefinedMeasurementCollector> *)&local_c9,
                 (shared_ptr<celero::TestFixture> *)local_88);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
      }
      pEVar3 = celero::ExperimentResult::getExperiment
                         ((r->
                          super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      uVar4 = celero::Experiment::getSamples(pEVar3);
      bVar1 = uVar4 == 0;
      if (!bVar1) {
        do {
          local_58.
          super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_b8._0_8_;
          local_58.
          super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
            }
          }
          bVar2 = ExecuteProblemSpace::anon_class_16_1_54a39812::operator()
                            (&local_98,true,&local_58);
          if (local_58.
              super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_58.
                       super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (!bVar2) {
            celero::ExperimentResult::setFailure
                      ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,true);
            goto LAB_0012cb3e;
          }
          uVar4 = uVar4 - 1;
          bVar1 = uVar4 == 0;
        } while (!bVar1);
      }
      this = (r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_68.
      super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_b8._0_8_;
      local_68.
      super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_b8._8_8_ + 8) = *(_Atomic_word *)(local_b8._8_8_ + 8) + 1;
        }
      }
      celero::ExperimentResult::setUserDefinedMeasurements(this,&local_68);
      if (local_68.
          super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.
                   super___shared_ptr<celero::UserDefinedMeasurementCollector,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      celero::ExperimentResult::setComplete
                ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,true);
LAB_0012cb3e:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      goto LAB_0012cb4d;
    }
    celero::ExperimentResult::setFailure
              ((r->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               true);
  }
  bVar1 = false;
LAB_0012cb4d:
  if (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.r.super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool ExecuteProblemSpace(std::shared_ptr<celero::ExperimentResult> r)
{
	// Define a small internal function object to use to uniformly execute the tests.
	auto testRunner = [r](const bool record, std::shared_ptr<UserDefinedMeasurementCollector> udmCollector)
	{
		auto test = r->getExperiment()->getFactory()->Create();

		const auto runResult = RunAndCatchExc(*test, r->getExperiment()->getThreads(), r->getProblemSpaceIterations(), r->getProblemSpace());

		if(runResult.first == false)
		{
			// something bad happened
			return false;
		}

		const auto testTime = runResult.second;

		// Save test results
		if(record == true)
		{
			r->addRunTimeSample(testTime);
			r->addMemorySample(celero::GetRAMVirtualUsedByCurrentProcess());
			r->getExperiment()->incrementTotalRunTime(testTime);

			if(udmCollector != nullptr)
			{
				udmCollector->collect(test);
			}
		}

		return true;
	};

	if(r->getExperiment()->getSamples() > 0)
	{
		// make a first pass to maybe cache instructions/data or other kinds of fist-run-only costs
		if(testRunner(false, nullptr) == false)
		{
			r->setFailure(true);
			return false;
		}

		auto udmCollector = std::make_shared<UserDefinedMeasurementCollector>(r->getExperiment()->getFactory()->Create());

		for(auto i = r->getExperiment()->getSamples(); i > 0; --i)
		{
			if(testRunner(true, udmCollector) == false)
			{
				r->setFailure(true);
				return false;
			}
		}

		r->setUserDefinedMeasurements(udmCollector);
		r->setComplete(true);
	}
	else
	{
		std::cerr << "ERROR: Celero Test \"" << r->getExperiment()->getBenchmark()->getName() << "::" << r->getExperiment()->getName()
				  << "\" must have at least 1 sample." << std::endl;
		return false;
	}

	return true;
}